

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord3d>(Attribute *this,texcoord3d *v)

{
  value_type *pvVar1;
  optional<tinyusdz::value::texcoord3d> local_60;
  undefined1 local_40 [8];
  optional<tinyusdz::value::texcoord3d> ret;
  texcoord3d *v_local;
  Attribute *this_local;
  
  if (v == (texcoord3d *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._16_8_ = v;
    primvar::PrimVar::get_value<tinyusdz::value::texcoord3d>(&local_60,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::
    optional<tinyusdz::value::texcoord3d,_0>
              ((optional<tinyusdz::value::texcoord3d> *)local_40,&local_60);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::~optional(&local_60);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::value
                         ((optional<tinyusdz::value::texcoord3d> *)local_40);
      *(double *)ret.contained._16_8_ = pvVar1->s;
      *(double *)(ret.contained._16_8_ + 8) = pvVar1->t;
      *(double *)(ret.contained._16_8_ + 0x10) = pvVar1->r;
    }
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::~optional
              ((optional<tinyusdz::value::texcoord3d> *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }